

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::QuadMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::QuadMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  QuadMesh *pQVar11;
  BuildPrim *pBVar12;
  long lVar13;
  char *pcVar14;
  MutexSys *pMVar15;
  undefined8 uVar16;
  ulong uVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Lock<embree::MutexSys> local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Lock<embree::MutexSys> local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  vuint4 vprimID;
  vuint4 vgeomID;
  
  uVar6 = current->_begin;
  uVar7 = current->_end;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  local_b8._8_8_ = local_b8._0_8_;
  local_b8._0_8_ = 0xe0;
  this_01 = pTVar10->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_e8.locked = true;
    local_e8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_88._0_8_ = this_01;
    local_118.locked = true;
    local_118.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)local_88);
    Lock<embree::MutexSys>::~Lock(&local_118);
    Lock<embree::MutexSys>::~Lock(&local_e8);
  }
  uVar16 = local_b8._0_8_;
  pTVar10->bytesUsed = (long)(void **)local_b8._0_8_ + pTVar10->bytesUsed;
  sVar19 = pTVar10->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar17 = (long)(void **)local_b8._0_8_ + uVar20 + sVar19;
  pTVar10->cur = uVar17;
  if (pTVar10->end < uVar17) {
    pTVar10->cur = sVar19;
    pMVar15 = (MutexSys *)pTVar10->allocBlockSize;
    if ((MutexSys *)(local_b8._0_8_ * 4) < pMVar15 || local_b8._0_8_ * 4 - (long)pMVar15 == 0) {
      local_118.mutex = pMVar15;
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_118);
      pTVar10->ptr = pcVar18;
      sVar19 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar19;
      pTVar10->end = (size_t)local_118.mutex;
      pTVar10->cur = uVar16;
      if (local_118.mutex < (ulong)uVar16) {
        pTVar10->cur = 0;
        local_118.mutex = (MutexSys *)pTVar10->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_118);
        pTVar10->ptr = pcVar18;
        sVar19 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar19;
        pTVar10->end = (size_t)local_118.mutex;
        pTVar10->cur = uVar16;
        if (local_118.mutex < (ulong)uVar16) {
          pTVar10->cur = 0;
          pcVar18 = (char *)0x0;
          goto LAB_0045c658;
        }
      }
      pTVar10->bytesWasted = sVar19;
    }
    else {
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)local_b8);
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar20;
    pcVar18 = pTVar10->ptr + (uVar17 - local_b8._0_8_);
  }
LAB_0045c658:
  vgeomID.field_0.i[0] = 0xffffffff;
  vgeomID.field_0.i[1] = 0xffffffff;
  vgeomID.field_0.i[2] = 0xffffffff;
  vgeomID.field_0.i[3] = 0xffffffff;
  vprimID.field_0.i[0] = 0xffffffff;
  vprimID.field_0.i[1] = 0xffffffff;
  vprimID.field_0.i[2] = 0xffffffff;
  vprimID.field_0.i[3] = 0xffffffff;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_118.mutex = (MutexSys *)0x0;
  local_118.locked = false;
  local_118._9_7_ = 0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8.mutex = (MutexSys *)0x0;
  local_e8.locked = false;
  local_e8._9_7_ = 0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  pQVar11 = this->mesh;
  pBVar12 = this->morton;
  uVar8 = this->geomID_;
  aVar23 = _DAT_01f45a40;
  auVar24 = _DAT_01f45a30;
  for (lVar21 = 0; (ulong)(uVar7 - uVar6) << 2 != lVar21; lVar21 = lVar21 + 4) {
    uVar9 = *(uint *)((long)&pBVar12[uVar6].field_0 + lVar21 * 2 + 4);
    lVar22 = (ulong)uVar9 * *(long *)&pQVar11->field_0x68;
    lVar13 = *(long *)&(pQVar11->super_Geometry).field_0x58;
    pcVar14 = (pQVar11->vertices0).super_RawBufferView.ptr_ofs;
    sVar19 = (pQVar11->vertices0).super_RawBufferView.stride;
    auVar2 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + lVar22) * sVar19);
    auVar3 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + 4 + lVar22) * sVar19);
    auVar4 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + 8 + lVar22) * sVar19);
    auVar5 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar13 + 0xc + lVar22) * sVar19);
    auVar24 = minps(auVar24,auVar2);
    auVar26 = minps(auVar3,auVar4);
    auVar24 = minps(auVar24,auVar26);
    auVar24 = minps(auVar24,auVar5);
    auVar26 = maxps((undefined1  [16])aVar23,auVar2);
    auVar27 = maxps(auVar3,auVar4);
    auVar26 = maxps(auVar26,auVar27);
    aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar26,auVar5);
    *(uint *)((long)&vgeomID.field_0 + lVar21) = uVar8;
    *(uint *)((long)&vprimID.field_0 + lVar21) = uVar9;
    *(int *)((long)&local_118.mutex + lVar21) = auVar2._0_4_;
    *(int *)(local_108 + lVar21) = auVar2._4_4_;
    *(int *)(local_f8 + lVar21) = auVar2._8_4_;
    *(int *)((long)&local_e8.mutex + lVar21) = auVar3._0_4_;
    *(int *)(local_d8 + lVar21) = auVar3._4_4_;
    *(int *)(local_c8 + lVar21) = auVar3._8_4_;
    *(int *)(local_88 + lVar21) = auVar4._0_4_;
    *(int *)(local_78 + lVar21) = auVar4._4_4_;
    *(int *)(local_68 + lVar21) = auVar4._8_4_;
    *(int *)(local_b8 + lVar21) = auVar5._0_4_;
    *(int *)(local_a8 + lVar21) = auVar5._4_4_;
    *(int *)(local_98 + lVar21) = auVar5._8_4_;
  }
  *(MutexSys **)pcVar18 = local_118.mutex;
  pcVar18[8] = local_118.locked;
  pcVar18[9] = local_118._9_1_;
  pcVar18[10] = local_118._10_1_;
  pcVar18[0xb] = local_118._11_1_;
  pcVar18[0xc] = local_118._12_1_;
  pcVar18[0xd] = local_118._13_1_;
  pcVar18[0xe] = local_118._14_1_;
  pcVar18[0xf] = local_118._15_1_;
  *(undefined8 *)(pcVar18 + 0x10) = local_108._0_8_;
  *(undefined8 *)(pcVar18 + 0x18) = local_108._8_8_;
  *(undefined8 *)(pcVar18 + 0x20) = local_f8._0_8_;
  *(undefined8 *)(pcVar18 + 0x28) = local_f8._8_8_;
  *(MutexSys **)(pcVar18 + 0x30) = local_e8.mutex;
  pcVar18[0x38] = local_e8.locked;
  pcVar18[0x39] = local_e8._9_1_;
  pcVar18[0x3a] = local_e8._10_1_;
  pcVar18[0x3b] = local_e8._11_1_;
  pcVar18[0x3c] = local_e8._12_1_;
  pcVar18[0x3d] = local_e8._13_1_;
  pcVar18[0x3e] = local_e8._14_1_;
  pcVar18[0x3f] = local_e8._15_1_;
  *(undefined8 *)(pcVar18 + 0x40) = local_d8._0_8_;
  *(undefined8 *)(pcVar18 + 0x48) = local_d8._8_8_;
  *(undefined8 *)(pcVar18 + 0x50) = local_c8._0_8_;
  *(undefined8 *)(pcVar18 + 0x58) = local_c8._8_8_;
  *(undefined8 *)(pcVar18 + 0x60) = local_88._0_8_;
  *(undefined8 *)(pcVar18 + 0x68) = local_88._8_8_;
  *(undefined8 *)(pcVar18 + 0x70) = local_78._0_8_;
  *(undefined8 *)(pcVar18 + 0x78) = local_78._8_8_;
  *(undefined8 *)(pcVar18 + 0x80) = local_68._0_8_;
  *(undefined8 *)(pcVar18 + 0x88) = local_68._8_8_;
  *(undefined8 *)(pcVar18 + 0x90) = local_b8._0_8_;
  *(undefined8 *)(pcVar18 + 0x98) = local_b8._8_8_;
  *(undefined8 *)(pcVar18 + 0xa0) = local_a8._0_8_;
  *(undefined8 *)(pcVar18 + 0xa8) = local_a8._8_8_;
  *(undefined8 *)(pcVar18 + 0xb0) = local_98._0_8_;
  *(undefined8 *)(pcVar18 + 0xb8) = local_98._8_8_;
  *(ulong *)(pcVar18 + 0xc0) = CONCAT44(vgeomID.field_0.i[1],vgeomID.field_0.i[0]);
  *(ulong *)(pcVar18 + 200) = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
  *(ulong *)(pcVar18 + 0xd0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
  *(ulong *)(pcVar18 + 0xd8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
  aVar25._0_12_ = auVar24._0_12_;
  aVar25.m128[3] = (float)(current->_end - current->_begin);
  (__return_storage_ptr__->ref).ptr = (ulong)pcVar18 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar25;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar23;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Quad4v* accel = (Quad4v*) alloc.malloc1(sizeof(Quad4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero, v3 = zero;
        const QuadMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const QuadMesh::Quad& tri = mesh->quad(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          const Vec3fa& p3 = mesh->vertex(tri.v[3]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2,(vfloat4)p3);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
          v3.x[i] = p3.x; v3.y[i] = p3.y; v3.z[i] = p3.z;
        }
        Quad4v::store_nt(accel,Quad4v(v0,v1,v2,v3,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }